

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.h
# Opt level: O0

uint64_t absl::lts_20250127::str_format_internal::FormatConversionCharToConvInt(char conv)

{
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  uint64_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  uint64_t local_18;
  char conv_local;
  
  if (conv == 'c') {
    local_18 = FormatConversionCharToConvInt(0);
  }
  else {
    if (conv == 's') {
      local_20 = FormatConversionCharToConvInt(1);
    }
    else {
      if (conv == 'd') {
        local_28 = FormatConversionCharToConvInt(2);
      }
      else {
        if (conv == 'i') {
          local_30 = FormatConversionCharToConvInt(3);
        }
        else {
          if (conv == 'o') {
            local_38 = FormatConversionCharToConvInt(4);
          }
          else {
            if (conv == 'u') {
              local_40 = FormatConversionCharToConvInt(5);
            }
            else {
              if (conv == 'x') {
                local_48 = FormatConversionCharToConvInt(6);
              }
              else {
                if (conv == 'X') {
                  local_50 = FormatConversionCharToConvInt(7);
                }
                else {
                  if (conv == 'f') {
                    local_58 = FormatConversionCharToConvInt(8);
                  }
                  else {
                    if (conv == 'F') {
                      local_60 = FormatConversionCharToConvInt(9);
                    }
                    else {
                      if (conv == 'e') {
                        local_68 = FormatConversionCharToConvInt(10);
                      }
                      else {
                        if (conv == 'E') {
                          local_70 = FormatConversionCharToConvInt(0xb);
                        }
                        else {
                          if (conv == 'g') {
                            local_78 = FormatConversionCharToConvInt(0xc);
                          }
                          else {
                            if (conv == 'G') {
                              local_80 = FormatConversionCharToConvInt(0xd);
                            }
                            else {
                              if (conv == 'a') {
                                local_88 = FormatConversionCharToConvInt(0xe);
                              }
                              else {
                                if (conv == 'A') {
                                  local_90 = FormatConversionCharToConvInt(0xf);
                                }
                                else {
                                  if (conv == 'n') {
                                    local_98 = FormatConversionCharToConvInt(0x10);
                                  }
                                  else {
                                    if (conv == 'p') {
                                      local_a0 = FormatConversionCharToConvInt(0x11);
                                    }
                                    else {
                                      if (conv == 'v') {
                                        local_a8 = FormatConversionCharToConvInt(0x12);
                                      }
                                      else {
                                        local_a8 = (uint64_t)(int)(uint)(conv == '*');
                                      }
                                      local_a0 = local_a8;
                                    }
                                    local_98 = local_a0;
                                  }
                                  local_90 = local_98;
                                }
                                local_88 = local_90;
                              }
                              local_80 = local_88;
                            }
                            local_78 = local_80;
                          }
                          local_70 = local_78;
                        }
                        local_68 = local_70;
                      }
                      local_60 = local_68;
                    }
                    local_58 = local_60;
                  }
                  local_50 = local_58;
                }
                local_48 = local_50;
              }
              local_40 = local_48;
            }
            local_38 = local_40;
          }
          local_30 = local_38;
        }
        local_28 = local_30;
      }
      local_20 = local_28;
    }
    local_18 = local_20;
  }
  return local_18;
}

Assistant:

constexpr uint64_t FormatConversionCharToConvInt(char conv) {
  return
#define ABSL_INTERNAL_CHAR_SET_CASE(c)                                 \
  conv == #c[0]                                                        \
      ? FormatConversionCharToConvInt(FormatConversionCharInternal::c) \
      :
      ABSL_INTERNAL_CONVERSION_CHARS_EXPAND_(ABSL_INTERNAL_CHAR_SET_CASE, )
#undef ABSL_INTERNAL_CHAR_SET_CASE
                  conv == '*'
          ? 1
          : 0;
}